

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCode.cpp
# Opt level: O0

void Hpipe::InstructionCode::write_code
               (StreamSepMaker *ss,CppEmitter *cpp_emitter,string *str,string *repl)

{
  size_type sVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  string *psVar5;
  uint uVar6;
  StreamSep local_320;
  allocator local_2d1;
  string local_2d0;
  size_type local_2b0;
  size_type pos_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>
  *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  VariableMap *__range1_1;
  string local_268;
  string local_248 [32];
  string local_228 [32];
  ostringstream local_208 [8];
  ostringstream val;
  allocator local_79;
  string local_78;
  size_type local_58;
  size_type pos_1;
  size_type pos;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>
  *p;
  iterator __end1;
  iterator __begin1;
  VariableMap *__range1;
  string *repl_local;
  string *str_local;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *ss_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
           ::begin(&cpp_emitter->variables);
  p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
         ::end(&cpp_emitter->variables);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&p);
    if (!bVar2) break;
    pos = (size_type)
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>
          ::operator*(&__end1);
    pos_1 = 0;
    while( true ) {
      pos_1 = find_var_in_code(str,(string *)pos,pos_1);
      if (pos_1 == 0xffffffffffffffff) break;
      psVar5 = (string *)std::__cxx11::string::replace((ulong)str,pos_1,(char *)0x0);
      std::__cxx11::string::operator=((string *)str,psVar5);
      lVar4 = std::__cxx11::string::size();
      pos_1 = lVar4 + 0xb + pos_1;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>
    ::operator++(&__end1);
  }
  local_58 = 0;
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"RETURN_STOP_CONT",&local_79);
    local_58 = find_var_in_code(str,&local_78,local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (local_58 == 0xffffffffffffffff) break;
    std::__cxx11::ostringstream::ostringstream(local_208);
    poVar3 = std::operator<<((ostream *)local_208,"HPIPE_DATA.inp_cont = &&c_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,cpp_emitter->nb_cont_label);
    poVar3 = std::operator<<(poVar3,"; return RET_STOP_CONT; c_");
    uVar6 = cpp_emitter->nb_cont_label + 1;
    cpp_emitter->nb_cont_label = uVar6;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6);
    std::operator<<(poVar3,":;");
    sVar1 = local_58;
    std::__cxx11::ostringstream::str();
    psVar5 = (string *)std::__cxx11::string::replace((ulong)str,sVar1,(string *)0x10);
    std::__cxx11::string::operator=((string *)str,psVar5);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::ostringstream::str();
    lVar4 = std::__cxx11::string::size();
    local_58 = lVar4 + local_58;
    std::__cxx11::string::~string(local_248);
    std::__cxx11::ostringstream::~ostringstream(local_208);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    std::__cxx11::string::string((string *)&__range1_1,(string *)str);
    CppEmitter::repl_data(&local_268,cpp_emitter,(string *)&__range1_1,repl);
    std::__cxx11::string::operator=((string *)str,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&__range1_1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
             ::begin(&cpp_emitter->variables);
  p_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
           ::end(&cpp_emitter->variables);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&p_1);
    if (!bVar2) break;
    pos_2 = (size_type)
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>
            ::operator*(&__end1_1);
    local_2b0 = 0;
    while( true ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,"__data",&local_2d1);
      local_2b0 = find_var_in_code(str,&local_2d0,local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      if (local_2b0 == 0xffffffffffffffff) break;
      psVar5 = (string *)std::__cxx11::string::replace((ulong)str,local_2b0,(char *)0x2,0x247135);
      std::__cxx11::string::operator=((string *)str,psVar5);
      local_2b0 = local_2b0 + 4;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>
    ::operator++(&__end1_1);
  }
  StreamSepMaker::operator<<(&local_320,ss,str);
  StreamSep::~StreamSep(&local_320);
  return;
}

Assistant:

void InstructionCode::write_code( StreamSepMaker &ss, CppEmitter *cpp_emitter, std::string str, const std::string &repl ) {
    // variables
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, p.first, pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 0, "HPIPE_DATA." );
            pos += 11 + p.first.size();
        }
    }

    // RETURN_CONT
    for( std::string::size_type pos = 0; ; ) {
        pos = find_var_in_code( str, "RETURN_STOP_CONT", pos );
        if ( pos == std::string::npos )
            break;
        // ++cpp_emitter->nb_cont_label;
        std::ostringstream val;
        val << "HPIPE_DATA.inp_cont = &&c_" << cpp_emitter->nb_cont_label << "; return RET_STOP_CONT; c_" << ++cpp_emitter->nb_cont_label << ":;";
        str = str.replace( pos, 16, val.str() );
        pos += val.str().size();
    }

    // data -> *( save + x ), ...
    if ( repl.size() )
        str = cpp_emitter->repl_data( str, repl );

    // __data -> data
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, "__data", pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 2, "", 0 );
            pos += 4;
        }
    }

    ss << str;
}